

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmBlock(ExpressionContext *ctx,VmModule *module,ExprBlock *node)

{
  ExprBase *expression;
  VmValue *pVVar1;
  IntrusiveList<ExprBase> *pIVar2;
  
  pIVar2 = &node->expressions;
  while (expression = pIVar2->head, expression != (ExprBase *)0x0) {
    CompileVm(ctx,module,expression);
    pIVar2 = (IntrusiveList<ExprBase> *)&expression->next;
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  pVVar1 = anon_unknown.dwarf_f89de::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmBlock(ExpressionContext &ctx, VmModule *module, ExprBlock *node)
{
	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	return CheckType(ctx, node, CreateVoid(module));
}